

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O0

void __thiscall helics::apps::Source::setStartTime(Source *this,string_view key,Time startTime)

{
  bool bVar1;
  deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_> *this_00;
  reference pvVar2;
  baseType in_RCX;
  long in_RDI;
  iterator fnd;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *in_stack_ffffffffffffffb8;
  _Self local_30;
  _Self local_28 [2];
  baseType local_18;
  
  local_18 = in_RCX;
  local_28[0]._M_node =
       (_Base_ptr)
       CLI::std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::find(in_stack_ffffffffffffffb8,(key_type *)0x409083);
  local_30._M_node =
       (_Base_ptr)
       CLI::std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::end(in_stack_ffffffffffffffb8);
  bVar1 = CLI::std::operator==(local_28,&local_30);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = (deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_> *)
              (in_RDI + 0xa0);
    CLI::std::
    _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                  *)0x4090cf);
    pvVar2 = CLI::std::
             deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>::
             operator[](this_00,(size_type)in_stack_ffffffffffffffb8);
    (pvVar2->nextTime).internalTimeCode = local_18;
  }
  return;
}

Assistant:

void Source::setStartTime(std::string_view key, Time startTime)
    {
        auto fnd = pubids.find(key);
        if (fnd != pubids.end()) {
            sources[fnd->second].nextTime = startTime;
        }
    }